

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O3

int DispatchAlpha_SSE2(uint8_t *alpha,int alpha_stride,int width,int height,uint8_t *dst,
                      int dst_stride)

{
  ulong uVar1;
  byte bVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [14];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [14];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  unkuint9 Var14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [14];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  uint uVar19;
  byte bVar20;
  int iVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 uVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  
  auVar24 = _DAT_0012cc00;
  if (0 < height) {
    uVar19 = width - 1U & 0xfffffff8;
    auVar23 = ZEXT816(0xffffffffffffffff);
    iVar21 = 0;
    bVar20 = 0xff;
    do {
      uVar22 = 0;
      if (0 < (int)uVar19) {
        do {
          uVar1 = *(ulong *)(alpha + uVar22);
          auVar25._8_8_ = 0;
          auVar25._0_8_ = uVar1;
          auVar23 = auVar23 & auVar25;
          uVar27 = (undefined1)(uVar1 >> 0x38);
          auVar3._8_6_ = 0;
          auVar3._0_8_ = uVar1;
          auVar3[0xe] = uVar27;
          auVar5._8_4_ = 0;
          auVar5._0_8_ = uVar1;
          auVar5[0xc] = (char)(uVar1 >> 0x30);
          auVar5._13_2_ = auVar3._13_2_;
          auVar6._8_4_ = 0;
          auVar6._0_8_ = uVar1;
          auVar6._12_3_ = auVar5._12_3_;
          auVar7._8_2_ = 0;
          auVar7._0_8_ = uVar1;
          auVar7[10] = (char)(uVar1 >> 0x28);
          auVar7._11_4_ = auVar6._11_4_;
          auVar9._8_2_ = 0;
          auVar9._0_8_ = uVar1;
          auVar9._10_5_ = auVar7._10_5_;
          auVar10[8] = (char)(uVar1 >> 0x20);
          auVar10._0_8_ = uVar1;
          auVar10._9_6_ = auVar9._9_6_;
          auVar13._7_8_ = 0;
          auVar13._0_7_ = auVar10._8_7_;
          Var14 = CONCAT81(SUB158(auVar13 << 0x40,7),(char)(uVar1 >> 0x18));
          auVar17._9_6_ = 0;
          auVar17._0_9_ = Var14;
          auVar15._1_10_ = SUB1510(auVar17 << 0x30,5);
          auVar15[0] = (char)(uVar1 >> 0x10);
          auVar18._11_4_ = 0;
          auVar18._0_11_ = auVar15;
          auVar11[2] = (char)(uVar1 >> 8);
          auVar11._0_2_ = (ushort)uVar1;
          auVar11._3_12_ = SUB1512(auVar18 << 0x20,3);
          auVar12._2_13_ = auVar11._2_13_;
          auVar12._0_2_ = (ushort)uVar1 & 0xff;
          auVar4._10_2_ = 0;
          auVar4._0_10_ = auVar12._0_10_;
          auVar4._12_2_ = (short)Var14;
          auVar16._2_4_ = auVar4._10_4_;
          auVar16._0_2_ = auVar15._0_2_;
          auVar16._6_8_ = 0;
          auVar8._4_2_ = auVar11._2_2_;
          auVar8._0_4_ = auVar12._0_4_;
          auVar8._6_8_ = SUB148(auVar16 << 0x40,6);
          auVar28._0_4_ = auVar12._0_4_ & 0xffff;
          auVar28._4_10_ = auVar8._4_10_;
          auVar28._14_2_ = 0;
          auVar26._2_2_ = 0;
          auVar26._0_2_ = auVar10._8_2_;
          auVar26._4_2_ = auVar7._10_2_;
          auVar26._6_2_ = 0;
          auVar26._8_2_ = auVar5._12_2_;
          auVar26._10_2_ = 0;
          auVar26[0xc] = uVar27;
          auVar26._13_3_ = 0;
          auVar25 = *(undefined1 (*) [16])(dst + uVar22 * 4 + 0x10);
          *(undefined1 (*) [16])(dst + uVar22 * 4) =
               *(undefined1 (*) [16])(dst + uVar22 * 4) & auVar24 | auVar28;
          *(undefined1 (*) [16])(dst + uVar22 * 4 + 0x10) = auVar25 & auVar24 | auVar26;
          uVar22 = uVar22 + 8;
        } while ((long)uVar22 < (long)(int)uVar19);
      }
      if ((int)uVar22 < width) {
        uVar22 = uVar22 & 0xffffffff;
        do {
          bVar2 = alpha[uVar22];
          dst[uVar22 * 4] = bVar2;
          bVar20 = bVar20 & bVar2;
          uVar22 = uVar22 + 1;
        } while ((uint)width != uVar22);
      }
      alpha = alpha + alpha_stride;
      dst = dst + dst_stride;
      iVar21 = iVar21 + 1;
    } while (iVar21 != height);
    auVar24[0] = -(auVar23[0] == -1);
    auVar24[1] = -(auVar23[1] == -1);
    auVar24[2] = -(auVar23[2] == -1);
    auVar24[3] = -(auVar23[3] == -1);
    auVar24[4] = -(auVar23[4] == -1);
    auVar24[5] = -(auVar23[5] == -1);
    auVar24[6] = -(auVar23[6] == -1);
    auVar24[7] = -(auVar23[7] == -1);
    auVar24[8] = -(auVar23[8] == '\0');
    auVar24[9] = -(auVar23[9] == '\0');
    auVar24[10] = -(auVar23[10] == '\0');
    auVar24[0xb] = -(auVar23[0xb] == '\0');
    auVar24[0xc] = -(auVar23[0xc] == '\0');
    auVar24[0xd] = -(auVar23[0xd] == '\0');
    auVar24[0xe] = -(auVar23[0xe] == '\0');
    auVar24[0xf] = -(auVar23[0xf] == '\0');
    return (uint)((bVar20 & (SUB161(auVar24 >> 7,0) & 1 | (SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar24 >> 0x37,0) & 1) << 6 | SUB161(auVar24 >> 0x3f,0) << 7))
                 != 0xff);
  }
  return 0;
}

Assistant:

static int DispatchAlpha_SSE2(const uint8_t* WEBP_RESTRICT alpha,
                              int alpha_stride, int width, int height,
                              uint8_t* WEBP_RESTRICT dst, int dst_stride) {
  // alpha_and stores an 'and' operation of all the alpha[] values. The final
  // value is not 0xff if any of the alpha[] is not equal to 0xff.
  uint32_t alpha_and = 0xff;
  int i, j;
  const __m128i zero = _mm_setzero_si128();
  const __m128i rgb_mask = _mm_set1_epi32(0xffffff00u);  // to preserve RGB
  const __m128i all_0xff = _mm_set_epi32(0, 0, ~0u, ~0u);
  __m128i all_alphas = all_0xff;

  // We must be able to access 3 extra bytes after the last written byte
  // 'dst[4 * width - 4]', because we don't know if alpha is the first or the
  // last byte of the quadruplet.
  const int limit = (width - 1) & ~7;

  for (j = 0; j < height; ++j) {
    __m128i* out = (__m128i*)dst;
    for (i = 0; i < limit; i += 8) {
      // load 8 alpha bytes
      const __m128i a0 = _mm_loadl_epi64((const __m128i*)&alpha[i]);
      const __m128i a1 = _mm_unpacklo_epi8(a0, zero);
      const __m128i a2_lo = _mm_unpacklo_epi16(a1, zero);
      const __m128i a2_hi = _mm_unpackhi_epi16(a1, zero);
      // load 8 dst pixels (32 bytes)
      const __m128i b0_lo = _mm_loadu_si128(out + 0);
      const __m128i b0_hi = _mm_loadu_si128(out + 1);
      // mask dst alpha values
      const __m128i b1_lo = _mm_and_si128(b0_lo, rgb_mask);
      const __m128i b1_hi = _mm_and_si128(b0_hi, rgb_mask);
      // combine
      const __m128i b2_lo = _mm_or_si128(b1_lo, a2_lo);
      const __m128i b2_hi = _mm_or_si128(b1_hi, a2_hi);
      // store
      _mm_storeu_si128(out + 0, b2_lo);
      _mm_storeu_si128(out + 1, b2_hi);
      // accumulate eight alpha 'and' in parallel
      all_alphas = _mm_and_si128(all_alphas, a0);
      out += 2;
    }
    for (; i < width; ++i) {
      const uint32_t alpha_value = alpha[i];
      dst[4 * i] = alpha_value;
      alpha_and &= alpha_value;
    }
    alpha += alpha_stride;
    dst += dst_stride;
  }
  // Combine the eight alpha 'and' into a 8-bit mask.
  alpha_and &= _mm_movemask_epi8(_mm_cmpeq_epi8(all_alphas, all_0xff));
  return (alpha_and != 0xff);
}